

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpl_model.c
# Opt level: O0

int_mv av1_compute_mv_difference
                 (TplDepFrame *tpl_frame,int row,int col,int step,int tpl_stride,int right_shift)

{
  undefined4 uVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  int in_ECX;
  int iVar5;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  uint8_t in_R9B;
  int_mv left_mv_diff;
  int left_error;
  int_mv up_mv_diff;
  int up_error;
  int current_mv_magnitude;
  int_mv current_mv;
  TplDepStats *tpl_stats;
  int_mv local_48;
  int local_44;
  int_mv local_40;
  int local_3c;
  short local_34;
  short sStack_32;
  int_mv local_4;
  
  lVar4 = *(long *)(in_RDI + 8);
  iVar2 = av1_tpl_ptr_pos(in_ESI,in_EDX,in_R8D,in_R9B);
  lVar4 = lVar4 + (long)iVar2 * 200;
  local_4 = (int_mv)*(int_mv *)
                     &((int_mv *)(lVar4 + 0xa4 + (long)*(char *)(lVar4 + 0xc0) * 4))->as_mv;
  local_34 = local_4.as_mv.row;
  iVar2 = (int)local_34;
  if (iVar2 < 1) {
    iVar2 = -iVar2;
  }
  sStack_32 = local_4.as_mv.col;
  iVar5 = (int)sStack_32;
  if (iVar5 < 1) {
    iVar5 = -iVar5;
  }
  local_3c = 0x7fffffff;
  if (-1 < in_ESI - in_ECX) {
    lVar4 = *(long *)(in_RDI + 8);
    iVar3 = av1_tpl_ptr_pos(in_ESI - in_ECX,in_EDX,in_R8D,in_R9B);
    lVar4 = lVar4 + (long)iVar3 * 200;
    uVar1 = *(undefined4 *)(lVar4 + 0xa4 + (long)*(char *)(lVar4 + 0xc0) * 4);
    local_40._0_2_ = (undefined2)uVar1;
    local_40.as_mv.row = local_34 - local_40._0_2_;
    local_40._2_2_ = (undefined2)((uint)uVar1 >> 0x10);
    local_40.as_mv.col = sStack_32 - local_40._2_2_;
    local_3c = (int)local_40.as_mv.row;
    if (local_3c < 1) {
      local_3c = -local_3c;
    }
    iVar3 = (int)local_40.as_mv.col;
    if (iVar3 < 1) {
      iVar3 = -iVar3;
    }
    local_3c = local_3c + iVar3;
  }
  local_44 = 0x7fffffff;
  if (-1 < in_EDX - in_ECX) {
    lVar4 = *(long *)(in_RDI + 8);
    iVar3 = av1_tpl_ptr_pos(in_ESI,in_EDX - in_ECX,in_R8D,in_R9B);
    lVar4 = lVar4 + (long)iVar3 * 200;
    uVar1 = *(undefined4 *)(lVar4 + 0xa4 + (long)*(char *)(lVar4 + 0xc0) * 4);
    local_48._0_2_ = (undefined2)uVar1;
    local_48.as_mv.row = local_34 - local_48._0_2_;
    local_48._2_2_ = (undefined2)((uint)uVar1 >> 0x10);
    local_48.as_mv.col = sStack_32 - local_48._2_2_;
    local_44 = (int)local_48.as_mv.row;
    if (local_44 < 1) {
      local_44 = -local_44;
    }
    iVar3 = (int)local_48.as_mv.col;
    if (iVar3 < 1) {
      iVar3 = -iVar3;
    }
    local_44 = local_44 + iVar3;
  }
  if ((local_3c < local_44) && (local_3c < iVar2 + iVar5)) {
    local_4 = local_40;
  }
  else if ((local_44 < local_3c) && (local_44 < iVar2 + iVar5)) {
    local_4 = local_48;
  }
  return (int_mv)local_4.as_int;
}

Assistant:

int_mv av1_compute_mv_difference(const TplDepFrame *tpl_frame, int row, int col,
                                 int step, int tpl_stride, int right_shift) {
  const TplDepStats *tpl_stats =
      &tpl_frame
           ->tpl_stats_ptr[av1_tpl_ptr_pos(row, col, tpl_stride, right_shift)];
  int_mv current_mv = tpl_stats->mv[tpl_stats->ref_frame_index[0]];
  int current_mv_magnitude =
      abs(current_mv.as_mv.row) + abs(current_mv.as_mv.col);

  // Retrieve the up and left neighbors.
  int up_error = INT_MAX;
  int_mv up_mv_diff;
  if (row - step >= 0) {
    tpl_stats = &tpl_frame->tpl_stats_ptr[av1_tpl_ptr_pos(
        row - step, col, tpl_stride, right_shift)];
    up_mv_diff = tpl_stats->mv[tpl_stats->ref_frame_index[0]];
    up_mv_diff.as_mv.row = current_mv.as_mv.row - up_mv_diff.as_mv.row;
    up_mv_diff.as_mv.col = current_mv.as_mv.col - up_mv_diff.as_mv.col;
    up_error = abs(up_mv_diff.as_mv.row) + abs(up_mv_diff.as_mv.col);
  }

  int left_error = INT_MAX;
  int_mv left_mv_diff;
  if (col - step >= 0) {
    tpl_stats = &tpl_frame->tpl_stats_ptr[av1_tpl_ptr_pos(
        row, col - step, tpl_stride, right_shift)];
    left_mv_diff = tpl_stats->mv[tpl_stats->ref_frame_index[0]];
    left_mv_diff.as_mv.row = current_mv.as_mv.row - left_mv_diff.as_mv.row;
    left_mv_diff.as_mv.col = current_mv.as_mv.col - left_mv_diff.as_mv.col;
    left_error = abs(left_mv_diff.as_mv.row) + abs(left_mv_diff.as_mv.col);
  }

  // Return the MV with the minimum distance from current.
  if (up_error < left_error && up_error < current_mv_magnitude) {
    return up_mv_diff;
  } else if (left_error < up_error && left_error < current_mv_magnitude) {
    return left_mv_diff;
  }
  return current_mv;
}